

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intvars.cc
# Opt level: O3

flat_integer_variables_valuations_range_t *
tchecker::flat_integer_variables_valuations_range
          (flat_integer_variables_valuations_range_t *__return_storage_ptr__,
          flat_integer_variables_t *intvars)

{
  ulong uVar1;
  invalid_argument *this;
  ulong uVar2;
  flat_integer_variables_valuations_iterator_t it;
  intvar_values_range_t local_98;
  undefined1 local_90 [16];
  stored_size_type sStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_90._8_8_ = 0;
  sStack_80 = 0;
  uVar1 = *(stored_size_type *)
           ((long)&(intvars->
                   super_size_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).
                   super_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._index._key_map.m_flat_tree.m_data.m_seq + 8);
  if (uVar1 == *(stored_size_type *)
                ((long)&(intvars->
                        super_size_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ).
                        super_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._index._value_map.m_flat_tree.m_data.m_seq + 8)) {
    uVar2 = 0;
    do {
      if (uVar1 <= uVar2) {
        cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>
        ::cartesian_iterator_t
                  (&__return_storage_ptr__->_begin,
                   (cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>
                    *)(local_90 + 8));
        cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>
        ::~cartesian_iterator_t
                  ((cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>
                    *)(local_90 + 8));
        return __return_storage_ptr__;
      }
      boost::container::dtl::
      flat_tree<boost::container::dtl::pair<unsigned_int,_tchecker::intvar_info_t>,_boost::container::dtl::select1st<unsigned_int>,_std::less<unsigned_int>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_int,_tchecker::intvar_info_t>_>_>
      ::find((flat_tree<boost::container::dtl::pair<unsigned_int,_tchecker::intvar_info_t>,_boost::container::dtl::select1st<unsigned_int>,_std::less<unsigned_int>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_int,_tchecker::intvar_info_t>_>_>
              *)local_90,
             (key_type *)
             &(intvars->
              super_size_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ).
              super_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._info);
      if ((pointer)local_90._0_8_ ==
          (intvars->
          super_size_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ).
          super_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._info.m_flat_tree.m_data.m_seq.m_holder.m_start +
          *(stored_size_type *)
           ((long)&(intvars->
                   super_size_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).
                   super_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._info.m_flat_tree.m_data.m_seq.m_holder + 8)) {
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this,"unknown variable ID");
        __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
      }
      local_98 = intvar_values_range((intvar_info_t *)(local_90._0_8_ + 4));
      cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>
      ::push_back((cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>
                   *)(local_90 + 8),&local_98);
      uVar2 = (ulong)((int)uVar2 + 1);
      uVar1 = *(stored_size_type *)
               ((long)&(intvars->
                       super_size_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).
                       super_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._index._key_map.m_flat_tree.m_data.m_seq + 8);
    } while (uVar1 == *(stored_size_type *)
                       ((long)&(intvars->
                               super_size_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ).
                               super_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._index._value_map.m_flat_tree.m_data.m_seq + 8));
  }
  __assert_fail("_key_map.size() == _value_map.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/index.hh"
                ,0x90,
                "size_t tchecker::index_t<unsigned int, std::basic_string<char>>::size() const [KEY = unsigned int, T = std::basic_string<char>]"
               );
}

Assistant:

tchecker::flat_integer_variables_valuations_range_t
flat_integer_variables_valuations_range(tchecker::flat_integer_variables_t const & intvars)
{
  tchecker::flat_integer_variables_valuations_iterator_t it;
  for (tchecker::intvar_id_t id = 0; id < intvars.size(); ++id)
    it.push_back(tchecker::intvar_values_range(intvars.info(id)));
  return tchecker::make_range(it, tchecker::past_the_end_iterator);
}